

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

uint64_t dup_const_func_mips64el(uint vece,uint64_t c)

{
  long lVar1;
  ulong uVar2;
  
  switch(vece) {
  case 0:
    uVar2 = c & 0xff;
    lVar1 = 0x101010101010101;
    break;
  case 1:
    uVar2 = c & 0xffff;
    lVar1 = 0x1000100010001;
    break;
  case 2:
    return c << 0x20 | c & 0xffffffff;
  case 3:
    return c;
  default:
    return 0;
  }
  return lVar1 * uVar2;
}

Assistant:

uint64_t dup_const_func(unsigned vece, uint64_t c)
{
    switch (vece) {
    case MO_8:
        return 0x0101010101010101ull * (uint8_t)c;
    case MO_16:
        return 0x0001000100010001ull * (uint16_t)c;
    case MO_32:
        return 0x0000000100000001ull * (uint32_t)c;
    case MO_64:
        return c;
    default:
        // g_assert_not_reached();
        return 0;
    }
}